

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

uchar * stbi_write_png_to_mem(uchar *pixels,int stride_bytes,int x,int y,int n,int *out_len)

{
  bool bVar1;
  undefined8 uVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  uchar *puVar6;
  uchar uVar7;
  uchar *puVar8;
  char *line_buffer;
  ulong uVar9;
  uchar *__src;
  int iVar10;
  size_t __n;
  int data_len;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  int filter_type;
  int iVar14;
  ushort uVar15;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  int iVar24;
  undefined1 auVar25 [64];
  int zlen;
  ulong local_b8;
  uchar *local_b0;
  int *local_a8;
  uchar *local_a0;
  ulong local_98;
  long local_90;
  size_t local_88;
  uchar *local_80;
  undefined1 local_78 [64];
  undefined1 auVar16 [16];
  
  iVar5 = stbi_write_force_png_filter;
  uVar12 = n * x;
  if (stride_bytes == 0) {
    stride_bytes = uVar12;
  }
  iVar10 = -1;
  if (stbi_write_force_png_filter < 5) {
    iVar10 = stbi_write_force_png_filter;
  }
  data_len = (uVar12 + 1) * y;
  local_b0 = pixels;
  puVar8 = (uchar *)malloc((long)data_len);
  if (puVar8 != (uchar *)0x0) {
    local_88 = (size_t)(int)uVar12;
    line_buffer = (char *)malloc(local_88);
    if (line_buffer == (char *)0x0) {
      free(puVar8);
    }
    else {
      local_b8 = (ulong)uVar12;
      local_a8 = out_len;
      if (0 < y) {
        local_90 = (long)(int)(uVar12 + 1);
        uVar13 = 0;
        local_98 = (ulong)(uint)y;
        auVar19 = vpbroadcastq_avx512f();
        local_78 = vmovdqu64_avx512f(auVar19);
        local_a0 = puVar8;
        do {
          iVar14 = iVar5;
          iVar11 = iVar10;
          if (iVar10 < 0) {
            iVar11 = 0x7fffffff;
            iVar14 = 0;
            filter_type = 0;
            do {
              stbiw__encode_png_line
                        (local_b0,stride_bytes,x,y,(int)uVar13,n,filter_type,line_buffer);
              auVar19 = vmovdqu64_avx512f(local_78);
              auVar20 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
              auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              iVar24 = 0;
              if (0 < (int)local_b8) {
                auVar25 = ZEXT1664((undefined1  [16])0x0);
                uVar9 = 0;
                do {
                  auVar22 = vpbroadcastq_avx512f();
                  auVar23 = vmovdqa64_avx512f(auVar25);
                  auVar25 = vporq_avx512f(auVar22,auVar20);
                  auVar22 = vporq_avx512f(auVar22,auVar21);
                  uVar2 = vpcmpuq_avx512f(auVar22,auVar19,2);
                  bVar3 = (byte)uVar2;
                  uVar2 = vpcmpuq_avx512f(auVar25,auVar19,2);
                  bVar4 = (byte)uVar2;
                  uVar15 = CONCAT11(bVar4,bVar3);
                  auVar16 = vmovdqu8_avx512vl(*(undefined1 (*) [16])(line_buffer + uVar9));
                  auVar17[1] = ((byte)(uVar15 >> 1) & 1) * auVar16[1];
                  auVar17[0] = (bVar3 & 1) * auVar16[0];
                  auVar17[2] = ((byte)(uVar15 >> 2) & 1) * auVar16[2];
                  auVar17[3] = ((byte)(uVar15 >> 3) & 1) * auVar16[3];
                  auVar17[4] = ((byte)(uVar15 >> 4) & 1) * auVar16[4];
                  auVar17[5] = ((byte)(uVar15 >> 5) & 1) * auVar16[5];
                  auVar17[6] = ((byte)(uVar15 >> 6) & 1) * auVar16[6];
                  auVar17[7] = ((byte)(uVar15 >> 7) & 1) * auVar16[7];
                  auVar17[8] = (bVar4 & 1) * auVar16[8];
                  auVar17[9] = (bVar4 >> 1 & 1) * auVar16[9];
                  auVar17[10] = (bVar4 >> 2 & 1) * auVar16[10];
                  auVar17[0xb] = (bVar4 >> 3 & 1) * auVar16[0xb];
                  auVar17[0xc] = (bVar4 >> 4 & 1) * auVar16[0xc];
                  auVar17[0xd] = (bVar4 >> 5 & 1) * auVar16[0xd];
                  auVar17[0xe] = (bVar4 >> 6 & 1) * auVar16[0xe];
                  auVar17[0xf] = -((char)bVar4 >> 7) * auVar16[0xf];
                  uVar9 = uVar9 + 0x10;
                  auVar16 = vpabsb_avx(auVar17);
                  auVar25 = vpmovzxbd_avx512f(auVar16);
                  auVar25 = vpaddd_avx512f(auVar23,auVar25);
                } while ((uVar12 + 0xf & 0xfffffff0) != uVar9);
                auVar19 = vmovdqa32_avx512f(auVar25);
                auVar20._0_4_ =
                     (uint)(bVar3 & 1) * auVar19._0_4_ | (uint)!(bool)(bVar3 & 1) * auVar23._0_4_;
                bVar1 = (bool)((byte)(uVar15 >> 1) & 1);
                auVar20._4_4_ = (uint)bVar1 * auVar19._4_4_ | (uint)!bVar1 * auVar23._4_4_;
                bVar1 = (bool)((byte)(uVar15 >> 2) & 1);
                auVar20._8_4_ = (uint)bVar1 * auVar19._8_4_ | (uint)!bVar1 * auVar23._8_4_;
                bVar1 = (bool)((byte)(uVar15 >> 3) & 1);
                auVar20._12_4_ = (uint)bVar1 * auVar19._12_4_ | (uint)!bVar1 * auVar23._12_4_;
                bVar1 = (bool)((byte)(uVar15 >> 4) & 1);
                auVar20._16_4_ = (uint)bVar1 * auVar19._16_4_ | (uint)!bVar1 * auVar23._16_4_;
                bVar1 = (bool)((byte)(uVar15 >> 5) & 1);
                auVar20._20_4_ = (uint)bVar1 * auVar19._20_4_ | (uint)!bVar1 * auVar23._20_4_;
                bVar1 = (bool)((byte)(uVar15 >> 6) & 1);
                auVar20._24_4_ = (uint)bVar1 * auVar19._24_4_ | (uint)!bVar1 * auVar23._24_4_;
                bVar1 = (bool)((byte)(uVar15 >> 7) & 1);
                auVar20._28_4_ = (uint)bVar1 * auVar19._28_4_ | (uint)!bVar1 * auVar23._28_4_;
                auVar20._32_4_ =
                     (uint)(bVar4 & 1) * auVar19._32_4_ | (uint)!(bool)(bVar4 & 1) * auVar23._32_4_;
                bVar1 = (bool)(bVar4 >> 1 & 1);
                auVar20._36_4_ = (uint)bVar1 * auVar19._36_4_ | (uint)!bVar1 * auVar23._36_4_;
                bVar1 = (bool)(bVar4 >> 2 & 1);
                auVar20._40_4_ = (uint)bVar1 * auVar19._40_4_ | (uint)!bVar1 * auVar23._40_4_;
                bVar1 = (bool)(bVar4 >> 3 & 1);
                auVar20._44_4_ = (uint)bVar1 * auVar19._44_4_ | (uint)!bVar1 * auVar23._44_4_;
                bVar1 = (bool)(bVar4 >> 4 & 1);
                auVar20._48_4_ = (uint)bVar1 * auVar19._48_4_ | (uint)!bVar1 * auVar23._48_4_;
                bVar1 = (bool)(bVar4 >> 5 & 1);
                auVar20._52_4_ = (uint)bVar1 * auVar19._52_4_ | (uint)!bVar1 * auVar23._52_4_;
                bVar1 = (bool)(bVar4 >> 6 & 1);
                auVar20._56_4_ = (uint)bVar1 * auVar19._56_4_ | (uint)!bVar1 * auVar23._56_4_;
                auVar20._60_4_ =
                     (uint)(bVar4 >> 7) * auVar19._60_4_ |
                     (uint)!(bool)(bVar4 >> 7) * auVar23._60_4_;
                auVar18 = vextracti64x4_avx512f(auVar20,1);
                auVar19 = vpaddd_avx512f(auVar20,ZEXT3264(auVar18));
                auVar16 = vpaddd_avx(auVar19._0_16_,auVar19._16_16_);
                auVar17 = vpshufd_avx(auVar16,0xee);
                auVar16 = vpaddd_avx(auVar16,auVar17);
                auVar17 = vpshufd_avx(auVar16,0x55);
                auVar16 = vpaddd_avx(auVar16,auVar17);
                iVar24 = auVar16._0_4_;
              }
              if (iVar24 < iVar11) {
                iVar11 = iVar24;
                iVar14 = filter_type;
              }
              filter_type = filter_type + 1;
            } while (filter_type != 5);
            uVar7 = '\x05';
            puVar8 = local_a0;
            iVar11 = iVar14;
            if (iVar14 != 5) goto LAB_0027e09b;
          }
          else {
LAB_0027e09b:
            stbiw__encode_png_line(local_b0,stride_bytes,x,y,(int)uVar13,n,iVar11,line_buffer);
            uVar7 = (uchar)iVar14;
          }
          puVar8[uVar13 * local_90] = uVar7;
          memcpy(puVar8 + uVar13 * local_90 + 1,line_buffer,local_88);
          uVar13 = uVar13 + 1;
        } while (uVar13 != local_98);
      }
      free(line_buffer);
      __src = stbi_zlib_compress(puVar8,data_len,&zlen,stbi_write_png_compression_level);
      free(puVar8);
      if (__src != (uchar *)0x0) {
        __n = (size_t)zlen;
        puVar8 = (uchar *)malloc(__n + 0x39);
        if (puVar8 != (uchar *)0x0) {
          *local_a8 = (int)(__n + 0x39);
          puVar8[0] = 0x89;
          puVar8[1] = 'P';
          puVar8[2] = 'N';
          puVar8[3] = 'G';
          puVar8[4] = '\r';
          puVar8[5] = '\n';
          puVar8[6] = '\x1a';
          puVar8[7] = '\n';
          puVar8[8] = '\0';
          puVar8[9] = '\0';
          puVar8[10] = '\0';
          puVar8[0xb] = '\r';
          puVar8[0xc] = 'I';
          puVar8[0xd] = 'H';
          puVar8[0xe] = 'D';
          puVar8[0xf] = 'R';
          puVar8[0x10] = (uchar)((uint)x >> 0x18);
          puVar8[0x11] = (uchar)((uint)x >> 0x10);
          puVar8[0x12] = (uchar)((uint)x >> 8);
          puVar8[0x13] = (uchar)x;
          puVar8[0x14] = (uchar)((uint)y >> 0x18);
          puVar8[0x15] = (uchar)((uint)y >> 0x10);
          puVar8[0x16] = (uchar)((uint)y >> 8);
          puVar8[0x17] = (uchar)y;
          puVar8[0x18] = '\b';
          local_80 = puVar8 + 0x1d;
          puVar8[0x19] = (&DAT_00458e80)[(long)n * 4];
          puVar8[0x1a] = '\0';
          puVar8[0x1b] = '\0';
          puVar8[0x1c] = '\0';
          stbiw__wpcrc(&local_80,0xd);
          puVar6 = local_80;
          *local_80 = (uchar)((uint)zlen >> 0x18);
          local_80[1] = (uchar)((uint)zlen >> 0x10);
          local_80[2] = (uchar)((uint)zlen >> 8);
          local_80[3] = (uchar)zlen;
          local_80[4] = 'I';
          local_80[5] = 'D';
          local_80[6] = 'A';
          local_80[7] = 'T';
          memmove(local_80 + 8,__src,__n);
          local_80 = puVar6 + __n + 8;
          free(__src);
          stbiw__wpcrc(&local_80,zlen);
          local_80[0] = '\0';
          local_80[1] = '\0';
          local_80[2] = '\0';
          local_80[3] = '\0';
          local_80[4] = 'I';
          local_80[5] = 'E';
          local_80[6] = 'N';
          local_80[7] = 'D';
          local_80 = local_80 + 8;
          stbiw__wpcrc(&local_80,0);
          return puVar8;
        }
      }
    }
  }
  return (uchar *)0x0;
}

Assistant:

STBIWDEF unsigned char *stbi_write_png_to_mem(const unsigned char *pixels, int stride_bytes, int x, int y, int n, int *out_len)
{
   int force_filter = stbi_write_force_png_filter;
   int ctype[5] = { -1, 0, 4, 2, 6 };
   unsigned char sig[8] = { 137,80,78,71,13,10,26,10 };
   unsigned char *out,*o, *filt, *zlib;
   signed char *line_buffer;
   int j,zlen;

   if (stride_bytes == 0)
      stride_bytes = x * n;

   if (force_filter >= 5) {
      force_filter = -1;
   }

   filt = (unsigned char *) STBIW_MALLOC((x*n+1) * y); if (!filt) return 0;
   line_buffer = (signed char *) STBIW_MALLOC(x * n); if (!line_buffer) { STBIW_FREE(filt); return 0; }
   for (j=0; j < y; ++j) {
      int filter_type;
      if (force_filter > -1) {
         filter_type = force_filter;
         stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, force_filter, line_buffer);
      } else { // Estimate the best filter by running through all of them:
         int best_filter = 0, best_filter_val = 0x7fffffff, est, i;
         for (filter_type = 0; filter_type < 5; filter_type++) {
            stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, filter_type, line_buffer);

            // Estimate the entropy of the line using this filter; the less, the better.
            est = 0;
            for (i = 0; i < x*n; ++i) {
               est += abs((signed char) line_buffer[i]);
            }
            if (est < best_filter_val) {
               best_filter_val = est;
               best_filter = filter_type;
            }
         }
         if (filter_type != best_filter) {  // If the last iteration already got us the best filter, don't redo it
            stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, best_filter, line_buffer);
            filter_type = best_filter;
         }
      }
      // when we get here, filter_type contains the filter type, and line_buffer contains the data
      filt[j*(x*n+1)] = (unsigned char) filter_type;
      STBIW_MEMMOVE(filt+j*(x*n+1)+1, line_buffer, x*n);
   }
   STBIW_FREE(line_buffer);
   zlib = stbi_zlib_compress(filt, y*( x*n+1), &zlen, stbi_write_png_compression_level);
   STBIW_FREE(filt);
   if (!zlib) return 0;

   // each tag requires 12 bytes of overhead
   out = (unsigned char *) STBIW_MALLOC(8 + 12+13 + 12+zlen + 12);
   if (!out) return 0;
   *out_len = 8 + 12+13 + 12+zlen + 12;

   o=out;
   STBIW_MEMMOVE(o,sig,8); o+= 8;
   stbiw__wp32(o, 13); // header length
   stbiw__wptag(o, "IHDR");
   stbiw__wp32(o, x);
   stbiw__wp32(o, y);
   *o++ = 8;
   *o++ = STBIW_UCHAR(ctype[n]);
   *o++ = 0;
   *o++ = 0;
   *o++ = 0;
   stbiw__wpcrc(&o,13);

   stbiw__wp32(o, zlen);
   stbiw__wptag(o, "IDAT");
   STBIW_MEMMOVE(o, zlib, zlen);
   o += zlen;
   STBIW_FREE(zlib);
   stbiw__wpcrc(&o, zlen);

   stbiw__wp32(o,0);
   stbiw__wptag(o, "IEND");
   stbiw__wpcrc(&o,0);

   STBIW_ASSERT(o == out + *out_len);

   return out;
}